

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchSolve.cpp
# Opt level: O1

bool Bmatch_GetGuess(vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                     *f,vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                        *g,vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                           *fo,
                    vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                    *gi,PI_PO_INFO *pInformation,METHOD method)

{
  pointer __src;
  void *__src_00;
  undefined8 *puVar1;
  long *plVar2;
  int iVar3;
  pointer pvVar4;
  iterator __position;
  void *__dest;
  void *pvVar5;
  uint uVar6;
  pointer ppVar8;
  suppWrap *psVar9;
  undefined7 uVar10;
  ulong uVar11;
  pointer ppsVar12;
  long lVar13;
  bool bVar14;
  uint uVar15;
  pointer ppsVar16;
  suppWrap *unaff_R13;
  pointer *pppsVar17;
  ulong uVar18;
  suppWrap **b;
  vector<suppWrap_*,_std::allocator<suppWrap_*>_> mapNodes;
  suppWrap *tmpWrap1;
  pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_> tmpPair;
  suppWrap *tmpW;
  vector<suppWrap_*,_std::allocator<suppWrap_*>_> local_f8;
  suppWrap *local_d8;
  ulong local_d0;
  suppWrap *local_c8;
  vector<suppWrap_*,_std::allocator<suppWrap_*>_> vStack_c0;
  value_type local_a8;
  PI_PO_INFO *local_80;
  uint local_78;
  uint local_74;
  vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
  *local_70;
  vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
  *local_68;
  vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
  *local_60;
  long local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  suppWrap *local_38;
  int iVar7;
  
  local_80 = pInformation;
  local_60 = gi;
  if (((f->
       super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start ==
       (f->
       super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish) ||
     ((g->
      super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (g->
      super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    __assert_fail("!f.empty() && !g.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bmatch/bmatchSolve.cpp"
                  ,0x77,
                  "bool Bmatch_GetGuess(vector<vector<suppWrap *>> &, vector<vector<suppWrap *>> &, vector<pair<suppWrap *, vector<suppWrap *>>> &, vector<pair<suppWrap *, vector<suppWrap *>>> &, PI_PO_INFO *, METHOD)"
                 );
  }
  local_a8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.first = (suppWrap *)0x0;
  local_a8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_start = (suppWrap **)0x0;
  local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (suppWrap **)0x0;
  local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (suppWrap **)0x0;
  bVar14 = true;
  if (method == M_ONE_TO_ONE) {
    lVar13 = 0;
    local_d0 = 0;
    local_70 = f;
    local_68 = fo;
    do {
      iVar7 = (int)lVar13;
      local_50 = (ulong)(iVar7 + -1 + (uint)(lVar13 == 0));
      if (((long)(f->
                 super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(f->
                 super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - lVar13 ==
          0) {
        bVar14 = false;
        goto LAB_007b5f35;
      }
      pvVar4 = (f->
               super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppsVar16 = pvVar4[lVar13].super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppsVar12 = *(pointer *)
                  ((long)&pvVar4[lVar13].super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>
                          ._M_impl.super__Vector_impl_data + 8);
      local_58 = lVar13;
      if (ppsVar16 != ppsVar12) {
        pppsVar17 = (pointer *)
                    ((long)&pvVar4[lVar13].
                            super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                            super__Vector_impl_data + 8);
        local_74 = iVar7 - 1;
        if (iVar7 == 0) {
          local_74 = 0;
        }
        local_78 = iVar7 + 1;
        local_48 = lVar13 * 3;
        do {
          unaff_R13 = *ppsVar16;
          ppVar8 = (local_80->_f_match).
                   super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = (uint)((ulong)((long)(local_80->_f_match).
                                       super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar8) >>
                        5);
          if (0 < (int)uVar6) {
            uVar11 = (ulong)(uVar6 & 0x7fffffff);
            do {
              if (unaff_R13 == ppVar8->first) {
                __src = ppsVar16 + 1;
                if (__src != ppsVar12) {
                  memmove(ppsVar16,__src,(long)ppsVar12 - (long)__src);
                }
                *pppsVar17 = *pppsVar17 + -1;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Not GOOD ",9);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
                std::ostream::put(-0x18);
                std::ostream::flush();
                goto LAB_007b5c4c;
              }
              ppVar8 = ppVar8 + 1;
              uVar11 = uVar11 - 1;
            } while (uVar11 != 0);
          }
          iVar7 = (int)((ulong)((long)(g->
                                      super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(g->
                                     super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 3);
          uVar6 = iVar7 * -0x55555555;
          if (local_78 != uVar6 &&
              SBORROW4(local_78,uVar6) == (int)(local_78 + iVar7 * 0x55555555) < 0) {
            uVar6 = local_78;
          }
          if (local_74 < uVar6) {
            local_40 = (ulong)uVar6;
            uVar11 = local_50;
LAB_007b5a37:
            pvVar4 = (g->
                     super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            b = pvVar4[uVar11].super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                super__Vector_impl_data._M_start;
            uVar6 = (uint)((ulong)((long)*(pointer *)
                                          ((long)&pvVar4[uVar11].
                                                  super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>
                                                  ._M_impl.super__Vector_impl_data + 8) - (long)b)
                          >> 3);
            if (0 < (int)uVar6) {
              uVar18 = (ulong)(uVar6 & 0x7fffffff);
              do {
                psVar9 = Bmatch_FindSuppWrap(&pInformation->_f_already_try,b);
                if (psVar9 != unaff_R13) {
                  psVar9 = *b;
                  ppVar8 = (local_80->_f_already_try).
                           super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  uVar6 = (uint)((ulong)((long)(local_80->_f_already_try).
                                               super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppVar8) >> 5);
                  local_d8 = psVar9;
                  if ((int)uVar6 < 1) goto LAB_007b5ae0;
                  lVar13 = 0;
                  goto LAB_007b5ad1;
                }
                b = b + 1;
                uVar18 = uVar18 - 1;
              } while (uVar18 != 0);
            }
            goto LAB_007b5a80;
          }
LAB_007b5c4c:
          lVar13 = local_48;
          f = local_70;
          if ((local_d0 & 1) != 0) break;
          pvVar4 = (local_70->
                   super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          __dest = *(void **)((long)&(pvVar4->
                                     super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>).
                                     _M_impl.super__Vector_impl_data + local_48 * 8);
          pvVar5 = *(void **)((long)&(pvVar4->
                                     super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>).
                                     _M_impl.super__Vector_impl_data + local_48 * 8 + 8);
          __src_00 = (void *)((long)__dest + 8);
          if (__src_00 != pvVar5) {
            memmove(__dest,__src_00,(long)pvVar5 - (long)__src_00);
          }
          plVar2 = (long *)((long)&(pvVar4->
                                   super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>).
                                   _M_impl.super__Vector_impl_data + lVar13 * 8 + 8);
          *plVar2 = *plVar2 + -8;
          puVar1 = (undefined8 *)
                   ((long)&(((f->
                             super__Vector_base<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>)._M_impl.
                           super__Vector_impl_data + lVar13 * 8);
          pppsVar17 = (pointer *)(puVar1 + 1);
          ppsVar16 = (pointer)*puVar1;
          ppsVar12 = *pppsVar17;
        } while (ppsVar16 != ppsVar12);
      }
      lVar13 = local_58 + 1;
    } while ((local_d0 & 1) == 0);
    if (local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<suppWrap*,std::allocator<suppWrap*>>::_M_realloc_insert<suppWrap*const&>
                ((vector<suppWrap*,std::allocator<suppWrap*>> *)&local_f8,
                 (iterator)
                 local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_d8);
    }
    else {
      *local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
       super__Vector_impl_data._M_finish = local_d8;
      local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_c8 = unaff_R13;
    std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::vector(&vStack_c0,&local_f8);
    ppsVar12 = local_a8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    ppsVar16 = local_a8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_a8.first = local_c8;
    local_a8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_a8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_a8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppsVar16 != (pointer)0x0) {
      operator_delete(ppsVar16,(long)ppsVar12 - (long)ppsVar16);
    }
    if (vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
    ::push_back(local_68,&local_a8);
    if (local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    uVar6 = (uint)((ulong)((long)(local_d8->funSupp).
                                 super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                          (long)(local_d8->funSupp).
                                super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3);
    if (0 < (int)uVar6) {
      local_80 = (PI_PO_INFO *)&local_80->_x_match;
      uVar11 = 0;
      do {
        local_38 = Bmatch_FindSuppWrap((vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                                        *)local_80,
                                       (local_d8->funSupp).
                                       super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                                       _M_impl.super__Vector_impl_data._M_start + uVar11);
        if (local_38 == (suppWrap *)0x0) {
          uVar15 = (uint)((ulong)((long)(unaff_R13->funSupp).
                                        super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)(unaff_R13->funSupp).
                                       super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 3);
          if (0 < (int)uVar15) {
            uVar18 = (ulong)(uVar15 & 0x7fffffff);
            lVar13 = 0;
            do {
              ppsVar16 = (unaff_R13->funSupp).
                         super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
              psVar9 = *(suppWrap **)((long)ppsVar16 + lVar13);
              iVar7 = psVar9->numOfInfluence;
              iVar3 = (local_d8->funSupp).
                      super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar11]->numOfInfluence;
              if ((iVar3 + -1 <= iVar7) && (iVar7 <= iVar3 + 1)) {
                if (local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<suppWrap*,std::allocator<suppWrap*>>::
                  _M_realloc_insert<suppWrap*const&>
                            ((vector<suppWrap*,std::allocator<suppWrap*>> *)&local_f8,
                             (iterator)
                             local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish,
                             (suppWrap **)((long)ppsVar16 + lVar13));
                }
                else {
                  *local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                   super__Vector_impl_data._M_finish = psVar9;
                  local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
              lVar13 = lVar13 + 8;
              uVar18 = uVar18 - 1;
            } while (uVar18 != 0);
          }
        }
        else if (local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                 super__Vector_impl_data._M_finish ==
                 local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage) {
          std::vector<suppWrap*,std::allocator<suppWrap*>>::_M_realloc_insert<suppWrap*const&>
                    ((vector<suppWrap*,std::allocator<suppWrap*>> *)&local_f8,
                     (iterator)
                     local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_38);
        }
        else {
          *local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_38;
          local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_c8 = (local_d8->funSupp).super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar11];
        std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::vector(&vStack_c0,&local_f8);
        ppsVar12 = local_a8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        ppsVar16 = local_a8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        local_a8.first = local_c8;
        local_a8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_a8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_a8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppsVar16 != (pointer)0x0) {
          operator_delete(ppsVar16,(long)ppsVar12 - (long)ppsVar16);
        }
        if (vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)vStack_c0.
                                super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_c0.
                                super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::
        vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
        ::push_back(local_60,&local_a8);
        if (local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != (uVar6 & 0x7fffffff));
    }
    bVar14 = true;
  }
LAB_007b5f35:
  if (local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_start != (suppWrap **)0x0) {
    operator_delete(local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.second.
                          super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.second.
                          super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar14;
  while (lVar13 = lVar13 + 0x20, (ulong)(uVar6 & 0x7fffffff) << 5 != lVar13) {
LAB_007b5ad1:
    if (*(suppWrap **)((long)&ppVar8->first + lVar13) == unaff_R13) {
      __position._M_current =
           *(suppWrap ***)
            ((long)&(ppVar8->second).super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                    _M_impl + lVar13 + 8);
      uVar10 = (undefined7)((ulong)ppVar8 >> 8);
      if (__position._M_current ==
          *(suppWrap ***)
           ((long)&(ppVar8->second).super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                   _M_impl + lVar13 + 0x10)) {
        local_d0 = CONCAT71(uVar10,1);
        std::vector<suppWrap*,std::allocator<suppWrap*>>::_M_realloc_insert<suppWrap*const&>
                  ((vector<suppWrap*,std::allocator<suppWrap*>> *)
                   ((long)&(ppVar8->second).
                           super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl +
                   lVar13),__position,&local_d8);
      }
      else {
        *__position._M_current = psVar9;
        plVar2 = (long *)((long)&(ppVar8->second).
                                 super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl
                         + lVar13 + 8);
        *plVar2 = *plVar2 + 8;
        local_d0 = CONCAT71(uVar10,1);
      }
      goto LAB_007b5a80;
    }
  }
LAB_007b5ae0:
  if (local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<suppWrap*,std::allocator<suppWrap*>>::_M_realloc_insert<suppWrap*const&>
              ((vector<suppWrap*,std::allocator<suppWrap*>> *)&local_f8,
               (iterator)
               local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_d8);
  }
  else {
    *local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
     super__Vector_impl_data._M_finish = psVar9;
    local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_c8 = unaff_R13;
  std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::vector(&vStack_c0,&local_f8);
  ppsVar12 = local_a8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  ppsVar16 = local_a8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_a8.first = local_c8;
  local_a8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_a8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_a8.second.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppsVar16 != (pointer)0x0) {
    operator_delete(ppsVar16,(long)ppsVar12 - (long)ppsVar16);
  }
  if (vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_c0.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
  ::push_back(&pInformation->_f_already_try,&local_a8);
  local_d0 = CONCAT71((int7)((ulong)psVar9 >> 8),1);
  if (local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_f8.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
LAB_007b5a80:
  if (((local_d0 & 1) != 0) || (uVar11 = uVar11 + 1, local_40 <= uVar11)) goto LAB_007b5c4c;
  goto LAB_007b5a37;
}

Assistant:

bool Bmatch_GetGuess ( vector< vector< suppWrap * > > & f,
					   vector< vector< suppWrap * > > & g,
					   vector< pair< suppWrap *, vector< suppWrap * > > > & fo,
					   vector< pair< suppWrap *, vector< suppWrap * > > > & gi,
					   PI_PO_INFO * pInformation,
					   METHOD method )
{
	assert( !f.empty() && !g.empty() );
	pair< suppWrap *, vector< suppWrap * > > tmpPair;
	vector< suppWrap * > mapNodes;
	suppWrap * tmpWrap1, * tmpWrap2, * tmpW;
	int piCap = 3, poCap = 1, currentIndex = 0;
	bool done = false, findPair = false, save = false, notGood = false;

    //int capacity = ( Abc_NtkPoNum( tmpInformation->_cir1 ) - Abc_NtkPoNum( tmpInformation->_cir2 ) );
    //capacity = (capacity >= 0) ? capacity + 1 : 1;

	switch( method ) {
		case M_ONE_TO_ONE:
            while( !findPair ) {
                if( currentIndex == f.size() ) return false;
                else { 
                    while( !f[currentIndex].empty() ){
                        tmpWrap2 = f[currentIndex][0];
                        for( int i = 0, n = pInformation->_f_match.size(); i < n; ++i ) {
                            if( tmpWrap2 == pInformation->_f_match[i].first ) {
                                f[currentIndex].erase(f[currentIndex].begin());
                    cout << "Not GOOD " << endl;
                                notGood = true;
                                break;
                            }
                        }
                        if( !notGood ) {
                        for( int i = (currentIndex >= poCap) ? currentIndex - poCap : 0,
                                 n = max((int)g.size(), currentIndex + poCap); i < n; ++i ) {
                            for( int j = 0, m = g[i].size(); j < m; ++j ) {
                                if( !(Bmatch_FindSuppWrap( pInformation->_f_already_try, g[i][j] ) == tmpWrap2) ) {
                                    tmpWrap1 = g[i][j];

                                    for( int k = 0, l = pInformation->_f_already_try.size(); k < l; ++k ) {
                                        if( pInformation->_f_already_try[k].first == tmpWrap2 ) {
                                            pInformation->_f_already_try[k].second.push_back(tmpWrap1);
                                            save = true;
                                            break;
                                        }
                                    }
                                    if( !save ) {
                                        mapNodes.push_back(tmpWrap1);
                                        tmpPair = make_pair(tmpWrap2, mapNodes);
                                        pInformation->_f_already_try.push_back(tmpPair);
                                        mapNodes.clear();
                                    }
                                    save = false;
                                    findPair = true;
                                    break;
                                }
                            }
                            if( findPair ) break;
                        }
                        }
                        notGood = false;
                        if( !findPair ) {
                            f[currentIndex].erase(f[currentIndex].begin());
                        }
                        else break;
                    }
                }
                ++currentIndex;
            }
            //
			// tmpWrap1 = g[0][0]; tmpWrap2 = f[0][0];
			mapNodes.push_back( tmpWrap1 );
			tmpPair = make_pair( tmpWrap2, mapNodes );
			fo.push_back(tmpPair);

			mapNodes.clear();
			for( int i = 0, n = tmpWrap1->funSupp.size(); i < n; ++i ) {
				tmpW = Bmatch_FindSuppWrap( pInformation->_x_match, tmpWrap1->funSupp[i] );
				if( tmpW != NULL ) {
					mapNodes.push_back( tmpW );
					done = true;
				}
				if( !done ) {
					for( int j = 0, m = tmpWrap2->funSupp.size(); j < m; ++j ) {
						if( tmpWrap2->funSupp[j]->numOfInfluence >= tmpWrap1->funSupp[i]->numOfInfluence - poCap &&
							tmpWrap2->funSupp[j]->numOfInfluence <= tmpWrap1->funSupp[i]->numOfInfluence + poCap ) {
							mapNodes.push_back( tmpWrap2->funSupp[j] );
						}
					}
				}
				tmpPair = make_pair( tmpWrap1->funSupp[i], mapNodes );
				gi.push_back(tmpPair);
				mapNodes.clear();
				done = false;
			}
            //
		break;
		default:
		break;
	}
    return true;
}